

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIncludeGuardCommand.cxx
# Opt level: O2

bool cmIncludeGuardCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  string *psVar4;
  cmValue cVar5;
  cmState *pcVar6;
  cmake *this;
  int iVar7;
  string_view input;
  allocator<char> local_b1;
  cmStateDirectory stateDir;
  string includeGuardVar;
  cmStateSnapshot dirSnapshot;
  cmCryptoHash hasher;
  
  __lhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (0x20 < (ulong)((long)pbVar1 - (long)__lhs)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stateDir,
               "given an invalid number of arguments. The command takes at most 1 argument.",
               (allocator<char> *)&includeGuardVar);
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_00363cc2:
    std::__cxx11::string::~string((string *)&stateDir);
    return false;
  }
  if (__lhs == pbVar1) {
    iVar7 = 0;
  }
  else {
    bVar3 = std::operator==(__lhs,"DIRECTORY");
    if (bVar3) {
      iVar7 = 1;
    }
    else {
      bVar3 = std::operator==(__lhs,"GLOBAL");
      if (!bVar3) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stateDir,"given an invalid scope: ",__lhs);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        goto LAB_00363cc2;
      }
      iVar7 = 2;
    }
  }
  pcVar2 = status->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dirSnapshot,"CMAKE_CURRENT_LIST_FILE",&local_b1);
  psVar4 = (string *)cmMakefile::GetDefinition(pcVar2,(string *)&dirSnapshot);
  cmCryptoHash::cmCryptoHash(&hasher,AlgoMD5);
  if (psVar4 == (string *)0x0) {
    psVar4 = &cmValue::Empty_abi_cxx11_;
  }
  input._M_str = (psVar4->_M_dataplus)._M_p;
  input._M_len = psVar4->_M_string_length;
  cmCryptoHash::HashString_abi_cxx11_((string *)&stateDir,&hasher,input);
  cmStrCat<char_const(&)[12],std::__cxx11::string,char_const(&)[3]>
            (&includeGuardVar,(char (*) [12])"__INCGUARD_",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stateDir,
             (char (*) [3])0x727eff);
  std::__cxx11::string::~string((string *)&stateDir);
  cmCryptoHash::~cmCryptoHash(&hasher);
  std::__cxx11::string::~string((string *)&dirSnapshot);
  pcVar2 = status->Makefile;
  if (iVar7 == 0) {
    bVar3 = cmMakefile::IsDefinitionSet(pcVar2,&includeGuardVar);
    if (!bVar3) {
      cmMakefile::AddDefinitionBool(pcVar2,&includeGuardVar,true);
      goto LAB_00363f20;
    }
  }
  else if (iVar7 == 1) {
    cVar5 = cmMakefile::GetProperty(pcVar2,&includeGuardVar);
    if (cVar5.Value == (string *)0x0) {
      cmMakefile::GetStateSnapshot(pcVar2);
      cmStateSnapshot::GetBuildsystemDirectoryParent(&dirSnapshot,(cmStateSnapshot *)&stateDir);
      while (pcVar6 = cmStateSnapshot::GetState(&dirSnapshot), pcVar6 != (cmState *)0x0) {
        cmStateSnapshot::GetDirectory(&stateDir,&dirSnapshot);
        cVar5 = cmStateDirectory::GetProperty(&stateDir,&includeGuardVar);
        if (cVar5.Value != (string *)0x0) goto LAB_00363e8c;
        cmStateSnapshot::GetBuildsystemDirectoryParent((cmStateSnapshot *)&hasher,&dirSnapshot);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stateDir,"TRUE",(allocator<char> *)&dirSnapshot);
      cmMakefile::SetProperty(pcVar2,&includeGuardVar,(string *)&stateDir);
LAB_00363f16:
      std::__cxx11::string::~string((string *)&stateDir);
      goto LAB_00363f20;
    }
  }
  else {
    this = cmMakefile::GetCMakeInstance(pcVar2);
    cVar5 = cmake::GetProperty(this,&includeGuardVar);
    if (cVar5.Value == (string *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stateDir,"TRUE",(allocator<char> *)&dirSnapshot);
      cmake::SetProperty(this,&includeGuardVar,(string *)&stateDir);
      goto LAB_00363f16;
    }
  }
LAB_00363e8c:
  cmExecutionStatus::SetReturnInvoked(status);
LAB_00363f20:
  std::__cxx11::string::~string((string *)&includeGuardVar);
  return true;
}

Assistant:

bool cmIncludeGuardCommand(std::vector<std::string> const& args,
                           cmExecutionStatus& status)
{
  if (args.size() > 1) {
    status.SetError(
      "given an invalid number of arguments. The command takes at "
      "most 1 argument.");
    return false;
  }

  IncludeGuardScope scope = VARIABLE;

  if (!args.empty()) {
    std::string const& arg = args[0];
    if (arg == "DIRECTORY") {
      scope = DIRECTORY;
    } else if (arg == "GLOBAL") {
      scope = GLOBAL;
    } else {
      status.SetError("given an invalid scope: " + arg);
      return false;
    }
  }

  std::string includeGuardVar = GetIncludeGuardVariableName(
    *status.GetMakefile().GetDefinition("CMAKE_CURRENT_LIST_FILE"));

  cmMakefile* const mf = &status.GetMakefile();

  switch (scope) {
    case VARIABLE:
      if (mf->IsDefinitionSet(includeGuardVar)) {
        status.SetReturnInvoked();
        return true;
      }
      mf->AddDefinitionBool(includeGuardVar, true);
      break;
    case DIRECTORY:
      if (CheckIncludeGuardIsSet(mf, includeGuardVar)) {
        status.SetReturnInvoked();
        return true;
      }
      mf->SetProperty(includeGuardVar, "TRUE");
      break;
    case GLOBAL:
      cmake* const cm = mf->GetCMakeInstance();
      if (cm->GetProperty(includeGuardVar)) {
        status.SetReturnInvoked();
        return true;
      }
      cm->SetProperty(includeGuardVar, "TRUE");
      break;
  }

  return true;
}